

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1.h
# Opt level: O2

void ncnn::conv1x1s2_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int i;
  int iVar7;
  long lVar8;
  uint c;
  ulong uVar9;
  float *pfVar10;
  float *pfVar11;
  ulong uVar12;
  long lVar13;
  float *pfVar14;
  int remain;
  int iVar15;
  int iVar16;
  ulong uVar17;
  float *pfVar18;
  long lVar19;
  long lVar20;
  float *pfVar21;
  float *pfVar22;
  float fVar23;
  Mat out;
  Mat local_90;
  Mat local_60;
  
  lVar13 = (long)bottom_blob->c;
  iVar1 = top_blob->w;
  iVar15 = top_blob->h;
  pvVar2 = _kernel->data;
  uVar12 = 0;
  if (iVar15 < 1) {
    iVar15 = 0;
  }
  pvVar3 = _bias->data;
  uVar17 = (ulong)(uint)top_blob->c;
  if (top_blob->c < 1) {
    uVar17 = uVar12;
  }
  lVar19 = (long)(bottom_blob->w * 2 + iVar1 * -2);
  lVar20 = lVar19 * 4;
  for (; uVar12 != uVar17; uVar12 = uVar12 + 1) {
    Mat::channel(&local_60,top_blob,(int)uVar12);
    if (pvVar3 == (void *)0x0) {
      fVar23 = 0.0;
    }
    else {
      fVar23 = *(float *)((long)pvVar3 + uVar12 * 4);
    }
    Mat::fill(&local_60,fVar23);
    uVar9 = 0;
    while( true ) {
      pfVar11 = (float *)local_60.data;
      if (lVar13 <= (long)(uVar9 | 3)) break;
      c = (uint)uVar9;
      Mat::channel(&local_90,bottom_blob,c);
      pfVar10 = (float *)local_90.data;
      Mat::~Mat(&local_90);
      Mat::channel(&local_90,bottom_blob,c | 1);
      pfVar14 = (float *)local_90.data;
      Mat::~Mat(&local_90);
      Mat::channel(&local_90,bottom_blob,c | 2);
      pfVar21 = (float *)local_90.data;
      Mat::~Mat(&local_90);
      Mat::channel(&local_90,bottom_blob,(int)(uVar9 | 3));
      pfVar18 = (float *)local_90.data;
      Mat::~Mat(&local_90);
      pfVar22 = (float *)((long)pvVar2 + uVar9 * 4 + uVar12 * lVar13 * 4);
      fVar23 = *pfVar22;
      fVar4 = pfVar22[1];
      fVar5 = pfVar22[2];
      fVar6 = pfVar22[3];
      for (iVar7 = 0; iVar7 != iVar15; iVar7 = iVar7 + 1) {
        lVar8 = 0;
        for (iVar16 = iVar1; 0 < iVar16; iVar16 = iVar16 + -1) {
          *pfVar11 = *(float *)((long)pfVar18 + lVar8) * fVar6 +
                     *(float *)((long)pfVar14 + lVar8) * fVar4 +
                     *(float *)((long)pfVar21 + lVar8) * fVar5 +
                     *(float *)((long)pfVar10 + lVar8) * fVar23 + *pfVar11;
          pfVar11 = pfVar11 + 1;
          lVar8 = lVar8 + 8;
        }
        pfVar10 = (float *)((long)pfVar10 + lVar8 + lVar20);
        pfVar14 = (float *)((long)pfVar14 + lVar8 + lVar20);
        pfVar21 = (float *)((long)pfVar21 + lVar8 + lVar20);
        pfVar18 = (float *)((long)pfVar18 + lVar8 + lVar20);
      }
      uVar9 = uVar9 + 4;
    }
    for (; pfVar11 = (float *)local_60.data, (long)uVar9 < lVar13; uVar9 = uVar9 + 1) {
      Mat::channel(&local_90,bottom_blob,(int)uVar9);
      pfVar22 = (float *)local_90.data;
      Mat::~Mat(&local_90);
      fVar23 = *(float *)((long)pvVar2 + uVar9 * 4 + uVar12 * lVar13 * 4);
      for (iVar7 = 0; iVar16 = iVar1, iVar7 != iVar15; iVar7 = iVar7 + 1) {
        for (; 0 < iVar16; iVar16 = iVar16 + -1) {
          *pfVar11 = *pfVar22 * fVar23 + *pfVar11;
          pfVar22 = pfVar22 + 2;
          pfVar11 = pfVar11 + 1;
        }
        pfVar22 = pfVar22 + lVar19;
      }
    }
    Mat::~Mat(&local_60);
  }
  return;
}

Assistant:

static void conv1x1s2_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2*outw + w;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for
    for (int p=0; p<outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        out.fill(bias0);

        int q = 0;

        for (; q+3<inch; q+=4)
        {
            float* outptr = out;

            const float* img0 = bottom_blob.channel(q);
            const float* img1 = bottom_blob.channel(q+1);
            const float* img2 = bottom_blob.channel(q+2);
            const float* img3 = bottom_blob.channel(q+3);

            const float* kernel0 = kernel + p*inch + q;
            const float k0 = kernel0[0];
            const float k1 = kernel0[1];
            const float k2 = kernel0[2];
            const float k3 = kernel0[3];

            const float* r0 = img0;
            const float* r1 = img1;
            const float* r2 = img2;
            const float* r3 = img3;

            for (int i = 0; i < outh; i++)
            {
                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = *r0 * k0;
                    float sum1 = *r1 * k1;
                    float sum2 = *r2 * k2;
                    float sum3 = *r3 * k3;

                    *outptr += sum + sum1 + sum2 + sum3;

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    r3 += 2;
                    outptr++;
                }

                r0 += tailstep;
                r1 += tailstep;
                r2 += tailstep;
                r3 += tailstep;
            }

        }

        for (; q<inch; q++)
        {
            float* outptr = out;

            const float* img0 = bottom_blob.channel(q);

            const float* kernel0 = kernel + p*inch + q;
            const float k0 = kernel0[0];

            const float* r0 = img0;

            for (int i = 0; i < outh; i++)
            {
                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = *r0 * k0;

                    *outptr += sum;

                    r0 += 2;
                    outptr++;
                }

                r0 += tailstep;
            }

        }
    }

}